

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O0

void __thiscall
spdlog::details::async_log_helper::async_msg::async_msg(async_msg *this,async_msg_type m_type)

{
  async_msg_type m_type_local;
  async_msg *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->level = info;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->time);
  this->thread_id = 0;
  std::__cxx11::string::string((string *)&this->txt);
  this->msg_type = m_type;
  this->msg_id = 0;
  return;
}

Assistant:

explicit async_msg(async_msg_type m_type)
            : level(level::info)
            , thread_id(0)
            , msg_type(m_type)
            , msg_id(0)
        {
        }